

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

SgrprojInfo
search_selfguided_restoration
          (uint8_t *dat8,int width,int height,int dat_stride,uint8_t *src8,int src_stride,
          int use_highbitdepth,int bit_depth,int pu_width,int pu_height,int32_t *rstbuf,
          int enable_sgr_ep_pruning,aom_internal_error_info *error_info)

{
  SgrprojInfo SVar1;
  int iVar2;
  int in_stack_00000010;
  long in_stack_00000028;
  int in_stack_00000030;
  uint8_t *in_stack_00000038;
  int64_t err_3;
  int64_t err_2;
  int bestep_ref;
  int64_t err_1;
  int64_t err;
  int flt_stride;
  int bestxqd [2];
  int exqd [2];
  int64_t besterr;
  int bestep;
  int idx;
  int ep;
  int32_t *flt1;
  int32_t *flt0;
  SgrprojInfo ret;
  int in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  undefined4 uStack_cc;
  int in_stack_ffffffffffffff38;
  undefined4 uStack_c4;
  int in_stack_ffffffffffffff40;
  int32_t *in_stack_ffffffffffffff48;
  int32_t *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int64_t *in_stack_ffffffffffffff68;
  aom_internal_error_info *error_info_00;
  int local_84;
  int local_80;
  int local_7c;
  long local_78;
  
  local_78 = in_stack_00000028 + 0x9dcd0;
  local_84 = 0;
  error_info_00 = (aom_internal_error_info *)0xffffffffffffffff;
  memset(&stack0xffffffffffffff60,0,8);
  if (in_stack_00000030 == 0) {
    for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
      compute_sgrproj_err((uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          (int)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_00000038
                          ,(int)((ulong)&stack0xffffffffffffff50 >> 0x20),in_stack_ffffffffffffff20,
                          in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff58,
                          (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff68,error_info_00);
      get_best_error((int64_t *)&stack0xffffffffffffff70,(int64_t)in_stack_ffffffffffffff50,
                     (int *)&stack0xffffffffffffff68,(int *)&stack0xffffffffffffff60,&local_84,
                     local_7c);
    }
  }
  else {
    for (local_80 = 0; iVar2 = local_84, local_80 < 4; local_80 = local_80 + 1) {
      local_7c = sgproj_ep_grp1_seed[local_80];
      compute_sgrproj_err((uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          (int)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_00000038
                          ,(int)((ulong)&stack0xffffffffffffff48 >> 0x20),in_stack_ffffffffffffff20,
                          in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff58,
                          (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff68,error_info_00);
      get_best_error((int64_t *)&stack0xffffffffffffff70,(int64_t)in_stack_ffffffffffffff48,
                     (int *)&stack0xffffffffffffff68,(int *)&stack0xffffffffffffff60,&local_84,
                     local_7c);
    }
    for (local_7c = local_84 + -1; local_7c < iVar2 + 2; local_7c = local_7c + 2) {
      if ((-1 < local_7c) && (local_7c < 10)) {
        in_stack_fffffffffffffef4 = in_stack_00000010;
        compute_sgrproj_err((uint8_t *)CONCAT44(in_stack_00000010,in_stack_fffffffffffffef0),
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                            (int)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                            in_stack_00000038,(int)((ulong)&stack0xffffffffffffff38 >> 0x20),
                            in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                            in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                            (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff68,error_info_00);
        get_best_error((int64_t *)&stack0xffffffffffffff70,
                       CONCAT44(uStack_c4,in_stack_ffffffffffffff38),(int *)&stack0xffffffffffffff68
                       ,(int *)&stack0xffffffffffffff60,&local_84,local_7c);
      }
    }
    for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
      local_7c = sgproj_ep_grp2_3[local_80][local_84];
      compute_sgrproj_err((uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_00000038 >> 0x20),(int)in_stack_00000038,
                          in_stack_00000010,in_stack_00000038,
                          (int)((ulong)&stack0xffffffffffffff30 >> 0x20),in_stack_ffffffffffffff20,
                          in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff58,
                          (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff68,error_info_00);
      get_best_error((int64_t *)&stack0xffffffffffffff70,
                     CONCAT44(uStack_cc,in_stack_ffffffffffffff30),(int *)&stack0xffffffffffffff68,
                     (int *)&stack0xffffffffffffff60,&local_84,local_7c);
    }
  }
  SVar1.xqd[0] = in_stack_ffffffffffffff60;
  SVar1.ep = local_84;
  SVar1.xqd[1] = in_stack_ffffffffffffff64;
  return SVar1;
}

Assistant:

static SgrprojInfo search_selfguided_restoration(
    const uint8_t *dat8, int width, int height, int dat_stride,
    const uint8_t *src8, int src_stride, int use_highbitdepth, int bit_depth,
    int pu_width, int pu_height, int32_t *rstbuf, int enable_sgr_ep_pruning,
    struct aom_internal_error_info *error_info) {
  int32_t *flt0 = rstbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  int ep, idx, bestep = 0;
  int64_t besterr = -1;
  int exqd[2], bestxqd[2] = { 0, 0 };
  int flt_stride = ((width + 7) & ~7) + 8;
  assert(pu_width == (RESTORATION_PROC_UNIT_SIZE >> 1) ||
         pu_width == RESTORATION_PROC_UNIT_SIZE);
  assert(pu_height == (RESTORATION_PROC_UNIT_SIZE >> 1) ||
         pu_height == RESTORATION_PROC_UNIT_SIZE);
  if (!enable_sgr_ep_pruning) {
    for (ep = 0; ep < SGRPROJ_PARAMS; ep++) {
      int64_t err;
      compute_sgrproj_err(dat8, width, height, dat_stride, src8, src_stride,
                          use_highbitdepth, bit_depth, pu_width, pu_height, ep,
                          flt0, flt1, flt_stride, exqd, &err, error_info);
      get_best_error(&besterr, err, exqd, bestxqd, &bestep, ep);
    }
  } else {
    // evaluate first four seed ep in first group
    for (idx = 0; idx < SGRPROJ_EP_GRP1_SEARCH_COUNT; idx++) {
      ep = sgproj_ep_grp1_seed[idx];
      int64_t err;
      compute_sgrproj_err(dat8, width, height, dat_stride, src8, src_stride,
                          use_highbitdepth, bit_depth, pu_width, pu_height, ep,
                          flt0, flt1, flt_stride, exqd, &err, error_info);
      get_best_error(&besterr, err, exqd, bestxqd, &bestep, ep);
    }
    // evaluate left and right ep of winner in seed ep
    int bestep_ref = bestep;
    for (ep = bestep_ref - 1; ep < bestep_ref + 2; ep += 2) {
      if (ep < SGRPROJ_EP_GRP1_START_IDX || ep > SGRPROJ_EP_GRP1_END_IDX)
        continue;
      int64_t err;
      compute_sgrproj_err(dat8, width, height, dat_stride, src8, src_stride,
                          use_highbitdepth, bit_depth, pu_width, pu_height, ep,
                          flt0, flt1, flt_stride, exqd, &err, error_info);
      get_best_error(&besterr, err, exqd, bestxqd, &bestep, ep);
    }
    // evaluate last two group
    for (idx = 0; idx < SGRPROJ_EP_GRP2_3_SEARCH_COUNT; idx++) {
      ep = sgproj_ep_grp2_3[idx][bestep];
      int64_t err;
      compute_sgrproj_err(dat8, width, height, dat_stride, src8, src_stride,
                          use_highbitdepth, bit_depth, pu_width, pu_height, ep,
                          flt0, flt1, flt_stride, exqd, &err, error_info);
      get_best_error(&besterr, err, exqd, bestxqd, &bestep, ep);
    }
  }

  SgrprojInfo ret;
  ret.ep = bestep;
  ret.xqd[0] = bestxqd[0];
  ret.xqd[1] = bestxqd[1];
  return ret;
}